

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

int __thiscall QRegularExpression::captureCount(QRegularExpression *this)

{
  bool bVar1;
  QRegularExpressionPrivate *pQVar2;
  QRegularExpression *in_RDI;
  int local_4;
  
  bVar1 = isValid(in_RDI);
  if (bVar1) {
    pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x14f712);
    local_4 = pQVar2->capturingCount;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int QRegularExpression::captureCount() const
{
    if (!isValid()) // will compile the pattern
        return -1;
    return d->capturingCount;
}